

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_variable_shellcode.c
# Opt level: O3

int main(void)

{
  char *pcVar1;
  intptr_t *ret;
  
  pcVar1 = getenv("SHELLCODE");
  printf("SHELLCODE = %p %s\n",pcVar1,pcVar1);
  printf("%p\n",pcVar1);
  return 0;
}

Assistant:

int main(void) {
  intptr_t *ret;
  ret = (intptr_t *) &ret + 2;
  char *shellcode = getenv("SHELLCODE");
  printf("SHELLCODE = %p %s\n", shellcode, shellcode);
  (*ret) = (intptr_t) shellcode;
  printf("%p\n", (void*)(*ret));
}